

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::commitFlips(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  MMAL_PARAMETER_MIRROR_T mirror;
  MMAL_PARAMETER_HEADER_T local_18;
  undefined4 local_10;
  
  local_10 = 0;
  local_18.id = 0x1000f;
  local_18.size = 0xc;
  if (this->horizontalFlip == true) {
    if (this->verticalFlip == false) {
      local_10 = 2;
    }
    else {
      local_10 = 3;
    }
  }
  else if (this->verticalFlip != false) {
    local_10 = 1;
  }
  MVar1 = mmal_port_parameter_set(*this->camera->output,&local_18);
  if (((MVar1 == MMAL_SUCCESS) &&
      (MVar1 = mmal_port_parameter_set(this->camera->output[1],&local_18), MVar1 == MMAL_SUCCESS))
     && (MVar1 = mmal_port_parameter_set(this->camera->output[2],&local_18), MVar1 == MMAL_SUCCESS))
  {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
  std::operator<<(poVar2,": Failed to set horizontal/vertical flip parameter.\n");
  return;
}

Assistant:

void Private_Impl_Still::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( horizontalFlip && verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( horizontalFlip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( camera->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[2], &mirror.hdr ) )
                cout << API_NAME << ": Failed to set horizontal/vertical flip parameter.\n";
        }